

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O2

RCOError __thiscall RCO::loadAttributes(RCO *this,RCOElement *el,uint32_t offset,uint32_t count)

{
  vector<RCOAttribute,_std::allocator<RCOAttribute>_> *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  void *__dest;
  __node_base *p_Var4;
  string *__return_storage_ptr__;
  pointer this_01;
  long lVar5;
  pointer __lhs;
  string ext;
  string path;
  string id;
  RCOAttribute attr;
  unordered_map<int,_RCOAttribute,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_RCOAttribute>_>_>
  filedata_indexes;
  string local_1e8;
  string local_1c8;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [16];
  RCOAttribute local_188;
  _Hashtable<int,_std::pair<const_int,_RCOAttribute>,_std::allocator<std::pair<const_int,_RCOAttribute>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_88;
  string local_50;
  
  this_00 = &el->attributes;
  __dest = operator_new__((ulong)count << 4);
  memcpy(__dest,this->mBuffer + offset,(ulong)count << 4);
  local_88._M_buckets = &local_88._M_single_bucket;
  local_88._M_bucket_count = 1;
  p_Var4 = &local_88._M_before_begin;
  local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88._M_element_count = 0;
  local_88._M_rehash_policy._M_max_load_factor = 1.0;
  local_88._M_rehash_policy._M_next_resize = 0;
  local_88._M_single_bucket = (__node_base_ptr)0x0;
  __return_storage_ptr__ = &local_1c8;
  uVar3 = 0;
  while( true ) {
    local_1e8._M_dataplus._M_p._0_4_ = uVar3;
    if (count <= uVar3) break;
    local_188.name._M_dataplus._M_p = (pointer)&local_188.name.field_2;
    local_188.name._M_string_length = 0;
    local_188.name.field_2._M_local_buf[0] = '\0';
    local_188.s._M_dataplus._M_p = (pointer)&local_188.s.field_2;
    local_188.s._M_string_length = 0;
    local_188.s.field_2._M_local_buf[0] = '\0';
    local_188.c._M_dataplus._M_p = (pointer)&local_188.c.field_2;
    local_188.c._M_string_length = 0;
    local_188.c.field_2._M_local_buf[0] = L'\0';
    local_188.fa.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_188.fa.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_188.ia.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_188.fa.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_188.ia.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.ia.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.fileext._M_dataplus._M_p = (pointer)&local_188.fileext.field_2;
    local_188.fileext._M_string_length = 0;
    local_188.fileext.field_2._M_local_buf[0] = '\0';
    local_188.idstr._M_dataplus._M_p = (pointer)&local_188.idstr.field_2;
    local_188.idstr._M_string_length = 0;
    local_188.idstr.field_2._M_local_buf[0] = '\0';
    lVar5 = (long)(int)uVar3 * 0x10;
    local_188.type = *(ATTRIBUTE_TYPE *)((long)__dest + lVar5 + 4);
    getStringTableString(this,&local_188.name,*(uint32_t *)((long)__dest + lVar5));
    switch(local_188.type) {
    case INTEGER:
      local_188.i = *(uint32_t *)((long)__dest + lVar5 + 8);
      goto LAB_0010484f;
    case FLOAT:
      local_188.f = *(float *)((long)__dest + lVar5 + 8);
      goto LAB_0010484f;
    case STRING:
      getStringTableString
                (this,&local_188.s,*(uint32_t *)((long)__dest + lVar5 + 8),
                 *(uint32_t *)((long)__dest + lVar5 + 0xc));
      break;
    case CHAR:
      getCharTableChar(this,&local_188.c,*(uint32_t *)((long)__dest + lVar5 + 8),
                       *(uint32_t *)((long)__dest + lVar5 + 0xc));
      break;
    case STYLE_ID:
      getStyleId(this,&local_188.s,*(uint32_t *)((long)__dest + lVar5 + 8));
      break;
    case INTEGER_ARRAY:
      getIntArray(this,&local_188.ia,*(uint32_t *)((long)__dest + lVar5 + 8),
                  *(uint32_t *)((long)__dest + lVar5 + 0xc));
      break;
    case FLOAT_ARRAY:
      getFloatArray(this,&local_188.fa,*(uint32_t *)((long)__dest + lVar5 + 8),
                    *(uint32_t *)((long)__dest + lVar5 + 0xc));
      break;
    case DATA:
      bVar2 = true;
      std::
      _Hashtable<int,std::pair<int_const,RCOAttribute>,std::allocator<std::pair<int_const,RCOAttribute>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<int&,RCOAttribute&>
                ((_Hashtable<int,std::pair<int_const,RCOAttribute>,std::allocator<std::pair<int_const,RCOAttribute>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_88,&local_1e8,&local_188);
      goto LAB_001048a7;
    case ID_STR_LPB:
    case ID_STR:
      bVar2 = false;
      getIdStringString(this,&local_188.idstr,*(uint32_t *)((long)__dest + lVar5 + 8),false);
      goto LAB_001048a7;
    case ID_INT_LPB:
    case ID_INT:
      local_188.idint =
           *(uint32_t *)
            (this->mBuffer +
            (ulong)*(uint *)((long)__dest + lVar5 + 8) + 4 + (ulong)(this->mHeader).id_int_start_off
            );
      goto LAB_0010484f;
    default:
      printf("unhandled type: %d\n");
LAB_0010484f:
      bVar2 = false;
      goto LAB_001048a7;
    }
    bVar2 = false;
LAB_001048a7:
    bVar1 = std::operator==(&local_188.name,"compress");
    if (bVar1) {
      RCOAttribute::toString_abi_cxx11_(__return_storage_ptr__,&local_188);
      bVar1 = std::operator==(__return_storage_ptr__,"on");
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      if (!bVar1) goto LAB_001048f7;
      el->isCompressed = true;
    }
    else {
LAB_001048f7:
      bVar1 = std::operator==(&local_188.name,"origsize");
      if (bVar1) {
        el->originalSize = local_188.i;
      }
    }
    if (!bVar2) {
      std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>::push_back(this_00,&local_188);
    }
    RCOAttribute::~RCOAttribute(&local_188);
    uVar3 = (uint)local_1e8._M_dataplus._M_p + 1;
  }
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    if (*(int *)&p_Var4[6]._M_nxt == 8) {
      lVar5 = (long)(int)*(size_type *)(p_Var4 + 1) * 0x10;
      getFileData(this,(uint8_t **)(p_Var4 + 0x16),(uint32_t *)(p_Var4 + 0x17),
                  *(uint32_t *)((long)__dest + lVar5 + 8),*(uint32_t *)((long)__dest + lVar5 + 0xc),
                  el->isCompressed,el->originalSize);
    }
    std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>::push_back
              (this_00,(value_type *)(p_Var4 + 2));
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1a8 = local_198;
  local_1a0 = 0;
  local_198[0] = 0;
  bVar2 = std::operator==(&el->name,"locale");
  if (bVar2) {
    std::__cxx11::string::assign((char *)&local_1c8);
    __return_storage_ptr__ = &local_1e8;
  }
  else {
    bVar2 = std::operator==(&el->name,"texture");
    if (((!bVar2) && (bVar2 = std::operator==(&el->name,"override_texture"), !bVar2)) &&
       (bVar2 = std::operator==(&el->name,"sounddata"), !bVar2)) {
      bVar2 = std::operator==(&el->name,"layout");
      if (!bVar2) goto LAB_00104a70;
      std::__cxx11::string::assign((char *)&local_1c8);
      __return_storage_ptr__ = &local_1e8;
    }
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
LAB_00104a70:
  for (this_01 = (el->attributes).super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      this_01 !=
      (el->attributes).super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
    bVar2 = std::operator==(&this_01->name,anon_var_dwarf_6775 + 0x27);
    if (bVar2) {
      RCOAttribute::toString_abi_cxx11_(&local_188.name,this_01);
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
    }
    bVar2 = std::operator==(&this_01->name,"type");
    if (bVar2) {
      RCOAttribute::toString_abi_cxx11_(&local_50,this_01);
      fileExtensionFromType(&local_188.name,&local_50);
      std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  for (__lhs = (this_00->super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>)._M_impl.
               super__Vector_impl_data._M_start; __lhs != this_01; __lhs = __lhs + 1) {
    bVar2 = std::operator==(&__lhs->name,"src");
    if (bVar2) {
      sprintf((char *)&local_188,"%s/%s.%s",local_1c8._M_dataplus._M_p,local_1a8,
              local_1e8._M_dataplus._M_p);
      std::__cxx11::string::assign((char *)&__lhs->s);
    }
    else {
      bVar2 = std::operator==(&__lhs->name,"src_4k");
      if (bVar2) {
        sprintf((char *)&local_188,"%s/%s_4k.%s",local_1c8._M_dataplus._M_p,local_1a8,
                local_1e8._M_dataplus._M_p);
        std::__cxx11::string::assign((char *)&__lhs->s);
      }
      else {
        bVar2 = std::operator==(&__lhs->name,"right");
        if (bVar2) {
          sprintf((char *)&local_188,"%s/%s_right.%s",local_1c8._M_dataplus._M_p,local_1a8,
                  local_1e8._M_dataplus._M_p);
          std::__cxx11::string::assign((char *)&__lhs->s);
        }
        else {
          bVar2 = std::operator==(&__lhs->name,"left");
          if (bVar2) {
            sprintf((char *)&local_188,"%s/%s_left.%s",local_1c8._M_dataplus._M_p,local_1a8,
                    local_1e8._M_dataplus._M_p);
            std::__cxx11::string::assign((char *)&__lhs->s);
          }
        }
      }
    }
    this_01 = (el->attributes).super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  operator_delete__(__dest);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::
  _Hashtable<int,_std::pair<const_int,_RCOAttribute>,_std::allocator<std::pair<const_int,_RCOAttribute>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_88);
  return NO_ERROR;
}

Assistant:

RCOError RCO::loadAttributes(RCOElement &el, uint32_t offset, uint32_t count)
{
	std::vector<RCOAttribute> &attributes = el.attributes;

	rco_tree_table_element_attribute_raw *raw_attr = new rco_tree_table_element_attribute_raw[count];

	memcpy(raw_attr, mBuffer + offset, sizeof(rco_tree_table_element_attribute_raw) * count);

	std::unordered_map<int, RCOAttribute> filedata_indexes;

	// Handle all attributes apart from files
	for (int i = 0; i < count; i++)
	{
		RCOAttribute attr;

		rco_tree_table_element_attribute_raw &cur_attr = raw_attr[i];

		attr.type = static_cast<ATTRIBUTE_TYPE>(cur_attr.type);
		getStringTableString(attr.name, cur_attr.string_offset);

		bool deferred = false;

		switch (attr.type)
		{
		case CHAR:
			getCharTableChar(attr.c, cur_attr.c.offset, cur_attr.c.len);
			break;
		case STRING:
			getStringTableString(attr.s, cur_attr.s.offset, cur_attr.s.len);
			break;
		case ID_STR_LPB:
			getIdStringString(attr.idstr, cur_attr.id.offset, true);
			break;
		case ID_STR:
			getIdStringString(attr.idstr, cur_attr.id.offset);
			break;
		case STYLE_ID:
			getStyleId(attr.s, cur_attr.s.offset);
			break;
		case FLOAT:
			attr.f = cur_attr.f;
			break;
		case INTEGER:
			attr.i = cur_attr.i;
			break;
		case INTEGER_ARRAY:
			getIntArray(attr.ia, cur_attr.ia.offset, cur_attr.ia.num);
			break;
		case FLOAT_ARRAY:
			getFloatArray(attr.fa, cur_attr.fa.offset, cur_attr.fa.num);
			break;
		case ID_INT:
		case ID_INT_LPB:
			getIdIntInt(attr.idint, cur_attr.idref.offset);
			break;
		case DATA:
			filedata_indexes.emplace(i, attr);
			deferred = true;
			break;
		default:
			printf("unhandled type: %d\n", attr.type);
		}

		if (attr.name == "compress" && attr.toString() == "on")
			el.isCompressed = true;
		else if (attr.name == "origsize")
			el.originalSize = attr.i;

		if (!deferred)
			attributes.push_back(attr);
	}

	// Handle files afterwards (deferred)
	for (auto it = filedata_indexes.begin(), end = filedata_indexes.end(); it != end; it++)
	{
		int index = (*it).first;
		RCOAttribute &attr = (*it).second;

		if (attr.type == DATA)
		{
			getFileData(&attr.file, attr.filelen, raw_attr[index].file.offset, raw_attr[index].file.size, el.isCompressed, el.originalSize);
		}

		attributes.push_back(attr);
	}

	std::string path;
	std::string ext;
	std::string id;

	if (el.name == "locale")
	{
		path = "xmls";
		ext = "xml";
	}
	else if (el.name == "texture" || el.name == "override_texture")
	{
		path = "textures";
	}
	else if (el.name == "sounddata")
	{
		path = "sounds";
	}
	else if (el.name == "layout")
	{
		path = "layouts";
		// Just a binary file but makes sense to give it a separate ext
		ext = "pslayout";
	}

	for (auto it = attributes.begin(); it != attributes.end(); it++)
	{
		if ((*it).name == "id")
			id = (*it).toString();
		if ((*it).name == "type")
			ext = RCO::fileExtensionFromType((*it).toString());
	}

	for (auto it = attributes.begin(); it != attributes.end(); it++)
	{
		if ((*it).name == "src")
		{
			char buf[256];
			sprintf(buf, "%s/%s.%s", path.c_str(), id.c_str(), ext.c_str());
			(*it).s = buf;
		}
		else if ((*it).name == "src_4k")
		{
			char buf[256];
			sprintf(buf, "%s/%s_4k.%s", path.c_str(), id.c_str(), ext.c_str());
			(*it).s = buf;
		}
		else if ((*it).name == "right")
		{
			char buf[256];
			sprintf(buf, "%s/%s_right.%s", path.c_str(), id.c_str(), ext.c_str());
			(*it).s = buf;
		}
		else if ((*it).name == "left")
		{
			char buf[256];
			sprintf(buf, "%s/%s_left.%s", path.c_str(), id.c_str(), ext.c_str());
			(*it).s = buf;
		}
	}

	delete[] raw_attr;

	return NO_ERROR;
}